

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
::TestBody(SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
           *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  SubjectSetRegister subject_register;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  AssertHelper local_208;
  internal local_200 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  undefined1 local_1f0 [112];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  SubjectSetRegister local_108 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_d8 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_a8 [48];
  _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> local_78;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_108);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_120,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_120,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_138,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_138,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_108);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_108);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_200[0] = (internal)(local_78._M_engaged ^ 1);
  local_1f8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78._M_engaged != false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,local_200,(AssertionResult *)0x224f5d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x17d,(char *)local_1f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if (local_210.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_210.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_210.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_150,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_150,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_168,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_168,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_108);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_108);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_move_assign
            (&local_78,
             (_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1f0);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1f0);
  local_200[0] = (internal)(local_78._M_engaged ^ 1);
  local_1f8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78._M_engaged != false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,local_200,(AssertionResult *)0x224f5d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x185,(char *)local_1f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if (local_210.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_210.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_210.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_180,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_180,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_108);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_move_assign
            (&local_78,
             (_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1f0);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1f0);
  local_200[0] = (internal)(local_78._M_engaged ^ 1);
  local_1f8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78._M_engaged != false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,local_200,(AssertionResult *)0x224f5d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x18b,(char *)local_1f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if (local_210.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_210.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_210.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset(&local_78)
  ;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_a8);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_d8);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);

    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Unregister(SS_SUBJECT2);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);
}